

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O2

void __thiscall
QNetworkReplyImplPrivate::setDownloadBuffer
          (QNetworkReplyImplPrivate *this,QSharedPointer<char> sp,qint64 size)

{
  QNetworkReply *this_00;
  QSharedPointer<char> *value;
  long in_FS_OFFSET;
  enable_if_t<std::is_copy_constructible_v<QSharedPointer<char>_>_&&_std::is_destructible_v<QSharedPointer<char>_>,_QVariant>
  eStack_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
  QSharedPointer<char>::operator=
            (&this->downloadBufferPointer,(QSharedPointer<char> *)sp.value.ptr.ptr);
  this->downloadBuffer = (this->downloadBufferPointer).value.ptr;
  this->downloadBufferCurrentSize = 0;
  this->downloadBufferMaximumSize = (qint64)sp.d;
  QVariant::fromValue<QSharedPointer<char>>
            (&eStack_48,(QVariant *)&this->downloadBufferPointer,value);
  QNetworkReply::setAttribute(this_00,DownloadBufferAttribute,&eStack_48);
  QVariant::~QVariant(&eStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::setDownloadBuffer(QSharedPointer<char> sp, qint64 size)
{
    Q_Q(QNetworkReplyImpl);

    downloadBufferPointer = sp;
    downloadBuffer = downloadBufferPointer.data();
    downloadBufferCurrentSize = 0;
    downloadBufferMaximumSize = size;
    q->setAttribute(QNetworkRequest::DownloadBufferAttribute, QVariant::fromValue<QSharedPointer<char> > (downloadBufferPointer));
}